

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O2

void Bitmap_Operation::Load(string *path,Image *raw)

{
  Image IStack_38;
  
  Load(&IStack_38,path);
  PenguinV_Image::ImageTemplate<unsigned_char>::swap(raw,&IStack_38);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&IStack_38);
  return;
}

Assistant:

void Load( const std::string & path, PenguinV_Image::Image & raw )
    {
        raw = Load( path );
    }